

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

size_t __thiscall cppurses::Text_display::first_index_at(Text_display *this,size_t line)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type local_18;
  size_t line_local;
  Text_display *this_local;
  
  sVar1 = std::
          vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
          ::size(&this->display_state_);
  local_18 = line;
  if (sVar1 <= line) {
    sVar1 = std::
            vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
            ::size(&this->display_state_);
    local_18 = sVar1 - 1;
  }
  pvVar2 = std::
           vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ::at(&this->display_state_,local_18);
  return pvVar2->start_index;
}

Assistant:

std::size_t Text_display::first_index_at(std::size_t line) const {
    if (line >= display_state_.size()) {
        line = display_state_.size() - 1;
    }
    return display_state_.at(line).start_index;
}